

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

unsigned_long zng_deflateBound(zng_stream *strm,unsigned_long sourceLen)

{
  uint8_t uVar1;
  internal_state *piVar2;
  int iVar3;
  long lVar4;
  ulong in_RSI;
  zng_stream *in_RDI;
  uchar *str;
  unsigned_long wraplen;
  unsigned_long complen;
  deflate_state *s;
  uint8_t *local_38;
  long local_30;
  long local_28;
  unsigned_long local_8;
  
  lVar4 = in_RSI + (in_RSI + 7 >> 3) + (in_RSI + 0x3f >> 6);
  local_28 = lVar4 + 5;
  iVar3 = deflateStateCheck(in_RDI);
  if (iVar3 == 0) {
    piVar2 = in_RDI->state;
    iVar3 = piVar2->wrap;
    if (iVar3 == 0) {
      local_30 = 0;
    }
    else if (iVar3 == 1) {
      iVar3 = 0;
      if (piVar2->strstart != 0) {
        iVar3 = 4;
      }
      local_30 = (long)(iVar3 + 6);
    }
    else if (iVar3 == 2) {
      local_30 = 0x12;
      if (piVar2->gzhead != (zng_gz_headerp)0x0) {
        if (piVar2->gzhead->extra != (uint8_t *)0x0) {
          local_30 = (ulong)(piVar2->gzhead->extra_len + 2) + 0x12;
        }
        local_38 = piVar2->gzhead->name;
        if (local_38 != (uint8_t *)0x0) {
          do {
            local_30 = local_30 + 1;
            uVar1 = *local_38;
            local_38 = local_38 + 1;
          } while (uVar1 != '\0');
        }
        local_38 = piVar2->gzhead->comment;
        if (local_38 != (uint8_t *)0x0) {
          do {
            local_30 = local_30 + 1;
            uVar1 = *local_38;
            local_38 = local_38 + 1;
          } while (uVar1 != '\0');
        }
        if (piVar2->gzhead->hcrc != 0) {
          local_30 = local_30 + 2;
        }
      }
    }
    else {
      local_30 = 6;
    }
    if (piVar2->w_bits == 0xf) {
      local_8 = in_RSI + (long)(int)(uint)(in_RSI == 0) + (long)(int)(uint)(in_RSI < 9) +
                (in_RSI + 7 >> 3) + 3 + local_30;
    }
    else {
      if (piVar2->level == 0) {
        local_28 = in_RSI + (in_RSI >> 5) + (in_RSI >> 7) + (in_RSI >> 0xb) + 7;
      }
      local_8 = local_28 + local_30;
    }
  }
  else {
    local_8 = lVar4 + 0xb;
  }
  return local_8;
}

Assistant:

unsigned long Z_EXPORT PREFIX(deflateBound)(PREFIX3(stream) *strm, unsigned long sourceLen) {
    deflate_state *s;
    unsigned long complen, wraplen;

    /* conservative upper bound for compressed data */
    complen = sourceLen + ((sourceLen + 7) >> 3) + ((sourceLen + 63) >> 6) + 5;
    DEFLATE_BOUND_ADJUST_COMPLEN(strm, complen, sourceLen);  /* hook for IBM Z DFLTCC */

    /* if can't get parameters, return conservative bound plus zlib wrapper */
    if (deflateStateCheck(strm))
        return complen + 6;

    /* compute wrapper length */
    s = strm->state;
    switch (s->wrap) {
    case 0:                                 /* raw deflate */
        wraplen = 0;
        break;
    case 1:                                 /* zlib wrapper */
        wraplen = ZLIB_WRAPLEN + (s->strstart ? 4 : 0);
        break;
#ifdef GZIP
    case 2:                                 /* gzip wrapper */
        wraplen = GZIP_WRAPLEN;
        if (s->gzhead != NULL) {            /* user-supplied gzip header */
            unsigned char *str;
            if (s->gzhead->extra != NULL) {
                wraplen += 2 + s->gzhead->extra_len;
            }
            str = s->gzhead->name;
            if (str != NULL) {
                do {
                    wraplen++;
                } while (*str++);
            }
            str = s->gzhead->comment;
            if (str != NULL) {
                do {
                    wraplen++;
                } while (*str++);
            }
            if (s->gzhead->hcrc)
                wraplen += 2;
        }
        break;
#endif
    default:                                /* for compiler happiness */
        wraplen = ZLIB_WRAPLEN;
    }

    /* if not default parameters, return conservative bound */
    if (DEFLATE_NEED_CONSERVATIVE_BOUND(strm) ||  /* hook for IBM Z DFLTCC */
            s->w_bits != MAX_WBITS || HASH_BITS < 15) {
        if (s->level == 0) {
            /* upper bound for stored blocks with length 127 (memLevel == 1) --
               ~4% overhead plus a small constant */
            complen = sourceLen + (sourceLen >> 5) + (sourceLen >> 7) + (sourceLen >> 11) + 7;
        }

        return complen + wraplen;
    }

#ifndef NO_QUICK_STRATEGY
    return sourceLen                       /* The source size itself */
      + (sourceLen == 0 ? 1 : 0)           /* Always at least one byte for any input */
      + (sourceLen < 9 ? 1 : 0)            /* One extra byte for lengths less than 9 */
      + DEFLATE_QUICK_OVERHEAD(sourceLen)  /* Source encoding overhead, padded to next full byte */
      + DEFLATE_BLOCK_OVERHEAD             /* Deflate block overhead bytes */
      + wraplen;                           /* none, zlib or gzip wrapper */
#else
    return sourceLen + (sourceLen >> 4) + 7 + wraplen;
#endif
}